

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.cc
# Opt level: O1

Optional<webrtc::CartesianPoint<float>_>
webrtc::GetDirectionIfLinear
          (vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
           *array_geometry)

{
  pointer pCVar1;
  string *result;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Optional<webrtc::CartesianPoint<float>_> OVar13;
  uint local_18c;
  FatalMessage local_188;
  
  local_188._0_8_ =
       ((long)(array_geometry->
              super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(array_geometry->
              super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  local_18c = 1;
  if ((ulong)local_188._0_8_ < 2) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                       ((unsigned_long *)&local_188,&local_18c,"array_geometry.size() > 1u");
  }
  else {
    result = (string *)0x0;
  }
  if (result != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/array_util.cc"
               ,0x3d,result);
    rtc::FatalMessage::~FatalMessage(&local_188);
  }
  uVar3 = 0x100000000;
  pCVar1 = (array_geometry->
           super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  fVar8 = pCVar1[1].c[0] - pCVar1->c[0];
  fVar9 = pCVar1[1].c[1] - pCVar1->c[1];
  fVar7 = pCVar1[1].c[2] - pCVar1->c[2];
  uVar6 = CONCAT44(fVar9,fVar8);
  uVar4 = ((long)(array_geometry->
                 super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 2) *
          -0x5555555555555555;
  if (2 < uVar4) {
    lVar5 = uVar4 - 2;
    pfVar2 = pCVar1[2].c + 2;
    do {
      fVar10 = ((CartesianPoint<float> *)(pfVar2 + -2))->c[0] - pfVar2[-5];
      fVar12 = fVar9 * (*pfVar2 - pfVar2[-3]) + (pfVar2[-1] - pfVar2[-4]) * -fVar7;
      fVar11 = fVar7 * fVar10 + (*pfVar2 - pfVar2[-3]) * -fVar8;
      fVar10 = fVar10 * -fVar9 + fVar8 * (pfVar2[-1] - pfVar2[-4]);
      if (1e-06 <= fVar10 * fVar10 + fVar12 * fVar12 + fVar11 * fVar11) {
        fVar7 = 0.0;
        uVar6 = 0;
        uVar3 = 0;
        break;
      }
      pfVar2 = pfVar2 + 3;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  OVar13._8_8_ = (uint)fVar7 | uVar3;
  OVar13.value_.c[0] = (float)(int)uVar6;
  OVar13.value_.c[1] = (float)(int)((ulong)uVar6 >> 0x20);
  return OVar13;
}

Assistant:

rtc::Optional<Point> GetDirectionIfLinear(
    const std::vector<Point>& array_geometry) {
  RTC_DCHECK_GT(array_geometry.size(), 1u);
  const Point first_pair_direction =
      PairDirection(array_geometry[0], array_geometry[1]);
  for (size_t i = 2u; i < array_geometry.size(); ++i) {
    const Point pair_direction =
        PairDirection(array_geometry[i - 1], array_geometry[i]);
    if (!AreParallel(first_pair_direction, pair_direction)) {
      return rtc::Optional<Point>();
    }
  }
  return rtc::Optional<Point>(first_pair_direction);
}